

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t ccsidr2_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  return (ulong)*(uint *)((long)env[1].banked_spsr +
                         (ulong)*(uint *)((long)(env->cp15).cptr_el +
                                         ((ulong)(((byte)ri->secure & 1) << 4) - 0x40)) * 8 + 4);
}

Assistant:

static uint64_t ccsidr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);

    /* Acquire the CSSELR index from the bank corresponding to the CCSIDR
     * bank
     */
    uint32_t index = A32_BANKED_REG_GET(env, csselr,
                                        ri->secure & ARM_CP_SECSTATE_S);

    return cpu->ccsidr[index];
}